

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setTextFormat(QMessageBox *this,TextFormat format)

{
  long lVar1;
  QMessageBoxPrivate *pQVar2;
  int in_ESI;
  QMessageBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  undefined1 in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 in_stack_ffffffffffffffa8;
  TextFormat TVar3;
  QLabel *this_00;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar6;
  QAnyStringView *local_18;
  
  TVar3 = (TextFormat)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMessageBox *)0x7a5ef9);
  QLabel::setTextFormat
            ((QLabel *)
             CONCAT17(in_stack_ffffffffffffffb7,
                      CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),TVar3);
  this_00 = pQVar2->label;
  bVar6 = 0;
  uVar4 = 1;
  uVar5 = uVar4;
  if ((in_ESI != 1) &&
     (in_stack_ffffffffffffffa7 = 0, uVar5 = in_stack_ffffffffffffffa7, in_ESI == 2)) {
    QLabel::text(this_00);
    bVar6 = 1;
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT17(1,CONCAT16(uVar4,in_stack_ffffffffffffffb0)),
               (QString *)this_00);
    in_stack_ffffffffffffffa7 = Qt::mightBeRichText(local_18);
    uVar5 = in_stack_ffffffffffffffa7;
  }
  TVar3 = (TextFormat)((ulong)this_00 >> 0x20);
  QLabel::setWordWrap((QLabel *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                      (bool)in_stack_ffffffffffffff9f);
  if ((bVar6 & 1) != 0) {
    QString::~QString((QString *)0x7a5fb1);
  }
  if (pQVar2->informativeLabel != (QLabel *)0x0) {
    QLabel::setTextFormat((QLabel *)CONCAT17(bVar6,CONCAT16(uVar5,in_stack_ffffffffffffffb0)),TVar3)
    ;
  }
  QMessageBoxPrivate::updateSize(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::setTextFormat(Qt::TextFormat format)
{
    Q_D(QMessageBox);
    d->label->setTextFormat(format);
    d->label->setWordWrap(format == Qt::RichText
                    || (format == Qt::AutoText && Qt::mightBeRichText(d->label->text())));
    if (d->informativeLabel)
        d->informativeLabel->setTextFormat(format);
    d->updateSize();
}